

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicVariousTessLevelsPosAttrCase::iterate
          (BasicVariousTessLevelsPosAttrCase *this)

{
  ostringstream *this_00;
  SpacingMode SVar1;
  RenderContext *pRVar2;
  code *pcVar3;
  Archive *archive;
  pointer pcVar4;
  TextureFormat TVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 uVar9;
  deUint32 err;
  undefined4 extraout_var;
  long lVar10;
  TextureFormat *pTVar11;
  TextureFormat TVar12;
  int i;
  ChannelType CVar13;
  long lVar14;
  ulong uVar15;
  TessPrimitiveType TVar16;
  ConstPixelBufferAccess *this_01;
  void *data;
  anon_struct_24_2_aa315ace *paVar17;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  TextureLevel reference;
  RandomViewport viewport;
  float innerLevels [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  float outerLevels [4];
  Surface rendered;
  VertexArrayBinding attrBindings [1];
  TextureFormat local_2d8;
  TextureFormat TStack_2d0;
  long local_2c8;
  TextureFormat TStack_2c0;
  undefined1 local_2b8 [8];
  char *local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined4 local_290;
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  RandomViewport local_260;
  long local_250;
  ChannelType local_244;
  float local_240 [2];
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  float local_1f8 [6];
  TestLog *local_1e0;
  Surface local_1d8;
  RenderContext *local_1c0;
  undefined1 local_1b8 [24];
  long local_1a0 [3];
  undefined8 local_188;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  TextureFormat local_170;
  ios_base local_148 [8];
  ios_base local_140 [272];
  undefined4 extraout_var_00;
  
  local_1e0 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (*pRVar2->_vptr_RenderContext[4])(pRVar2);
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  this_01 = (ConstPixelBufferAccess *)(ulong)dVar8;
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_260,(RenderTarget *)CONCAT44(extraout_var,iVar7),0x100,0x100,dVar8);
  dVar8 = (((this->m_program).m_ptr)->m_program).m_program;
  local_1c0 = pRVar2;
  iVar7 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  lVar10 = CONCAT44(extraout_var_00,iVar7);
  TVar16 = this->m_primitiveType;
  if (TVar16 == TESSPRIMITIVETYPE_TRIANGLES) {
    CVar13 = UNORM_INT8;
  }
  else if (TVar16 == TESSPRIMITIVETYPE_QUADS) {
    CVar13 = UNORM_INT16;
  }
  else {
    CVar13 = (uint)(TVar16 == TESSPRIMITIVETYPE_ISOLINES) * 5 - SNORM_INT16;
  }
  (**(code **)(lVar10 + 0x1a00))(local_260.x,local_260.y,local_260.width,local_260.height);
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar10 + 0x1680))(dVar8);
  local_244 = CVar13;
  (**(code **)(lVar10 + 0xfd8))(0x8e72,CVar13);
  paVar17 = iterate::tessLevelCases;
  local_250 = 0;
  do {
    SVar1 = this->m_spacing;
    lVar14 = 0;
    do {
      iVar7 = getClampedRoundedTessLevel(SVar1,paVar17->inner[lVar14]);
      local_240[lVar14] = (float)iVar7;
      lVar14 = lVar14 + 1;
    } while (lVar14 == 1);
    SVar1 = this->m_spacing;
    lVar14 = 0;
    do {
      iVar7 = getClampedRoundedTessLevel(SVar1,paVar17->outer[lVar14]);
      TVar16 = (TessPrimitiveType)this_01;
      local_1f8[lVar14] = (float)iVar7;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    local_1b8._0_8_ = local_1e0;
    this_00 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Tessellation levels: ",0x15);
    (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
              ((string *)local_2b8,(_anonymous_namespace_ *)local_240,local_1f8,
               (float *)(ulong)this->m_primitiveType,TVar16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,(char *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_),(long)local_2b0)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_) != &local_2a8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_),
                      local_2a8._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_140);
    pcVar3 = *(code **)(lVar10 + 0x14e0);
    uVar9 = (**(code **)(lVar10 + 0xb48))(dVar8,"u_tessLevelInner0");
    (*pcVar3)(local_240[0],uVar9);
    pcVar3 = *(code **)(lVar10 + 0x14e0);
    uVar9 = (**(code **)(lVar10 + 0xb48))(dVar8,"u_tessLevelInner1");
    (*pcVar3)(local_240[1],uVar9);
    pcVar3 = *(code **)(lVar10 + 0x14e0);
    uVar9 = (**(code **)(lVar10 + 0xb48))(dVar8,"u_tessLevelOuter0");
    (*pcVar3)(local_1f8[0],uVar9);
    pcVar3 = *(code **)(lVar10 + 0x14e0);
    uVar9 = (**(code **)(lVar10 + 0xb48))(dVar8,"u_tessLevelOuter1");
    (*pcVar3)(local_1f8[1],uVar9);
    pcVar3 = *(code **)(lVar10 + 0x14e0);
    uVar9 = (**(code **)(lVar10 + 0xb48))(dVar8,"u_tessLevelOuter2");
    (*pcVar3)(local_1f8[2],uVar9);
    pcVar3 = *(code **)(lVar10 + 0x14e0);
    uVar9 = (**(code **)(lVar10 + 0xb48))(dVar8,"u_tessLevelOuter3");
    (*pcVar3)(local_1f8[3],uVar9);
    (**(code **)(lVar10 + 0x188))(0x4000);
    local_2d8.order = R;
    local_2d8.type = SNORM_INT8;
    TStack_2d0.order = R;
    TStack_2d0.type = SNORM_INT8;
    local_2c8 = 0;
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)&local_2d8,
               4);
    if (this->m_primitiveType - TESSPRIMITIVETYPE_QUADS < 2) {
      local_1b8._0_8_ = (TestLog *)0xbf4ccccdbf4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
      local_1b8._0_8_ = (TestLog *)0xbf4ccccd3f4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
      local_1b8._0_8_ = (TestLog *)0x3f4ccccdbf4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
      local_1b8._0_8_ = (TestLog *)0x3f4ccccd3f4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
    }
    else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      local_1b8._0_8_ = (TestLog *)0x3f19999a3f4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
      local_1b8._0_8_ = (TestLog *)0xbf49374c00000000;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
      local_1b8._0_8_ = (TestLog *)0x3f19999abf4ccccd;
      std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
      emplace_back<tcu::Vector<float,2>>
                ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)&local_2d8,
                 (Vector<float,_2> *)local_1b8);
    }
    local_288._0_8_ = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"in_v_position","");
    TVar5 = TStack_2d0;
    TVar12 = local_2d8;
    local_2b8._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
    local_2b0 = (char *)((long)&local_2a8 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,local_288._0_8_,(pointer)(local_288._8_8_ + local_288._0_8_));
    local_290 = 0;
    local_1b8._0_4_ = local_2b8._0_4_;
    local_1b8._8_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1b8 + 8),local_2b0,local_2b0 + local_2a8._M_allocated_capacity);
    local_1a0[2]._0_4_ = local_290;
    local_188 = 8;
    local_180 = 2;
    local_17c = (undefined4)((ulong)((long)TVar5 - (long)TVar12) >> 3);
    local_178 = 0;
    local_170 = TVar12;
    if (local_2b0 != local_2a8._M_local_buf + 8) {
      operator_delete(local_2b0,local_2a8._8_8_ + 1);
    }
    CVar13 = local_244;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._0_8_ != &local_278) {
      operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
    }
    local_2b8._0_4_ = PRIMITIVETYPE_PATCHES;
    local_2b8._4_4_ = CVar13;
    local_2b0 = (char *)CONCAT44(local_2b0._4_4_,3);
    local_2a8._M_allocated_capacity = 0;
    glu::draw(((this->super_TestCase).m_context)->m_renderCtx,dVar8,1,
              (VertexArrayBinding *)local_1b8,(PrimitiveList *)local_2b8,(DrawUtilCallback *)0x0);
    err = (**(code **)(lVar10 + 0x800))();
    glu::checkError(err,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0x98d);
    if ((long *)local_1b8._8_8_ != local_1a0) {
      operator_delete((void *)local_1b8._8_8_,local_1a0[0] + 1);
    }
    if (local_2d8 != (TextureFormat)0x0) {
      operator_delete((void *)local_2d8,local_2c8 - (long)local_2d8);
    }
    getPixels(&local_1d8,local_1c0,local_260.x,local_260.y,local_260.width,local_260.height);
    archive = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive;
    pcVar4 = (this->m_referenceImagePathPrefix)._M_dataplus._M_p;
    local_238 = local_228;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar4,
               pcVar4 + (this->m_referenceImagePathPrefix)._M_string_length);
    std::__cxx11::string::append((char *)&local_238);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
    std::ostream::operator<<((MessageBuilder *)local_1b8,(int)local_250);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
    std::ios_base::~ios_base(local_148);
    uVar15 = 0xf;
    if (local_238 != local_228) {
      uVar15 = local_228[0];
    }
    if (uVar15 < (ulong)(local_210 + local_230)) {
      uVar15 = 0xf;
      if (local_218 != local_208) {
        uVar15 = local_208[0];
      }
      if (uVar15 < (ulong)(local_210 + local_230)) goto LAB_003d4d06;
      pTVar11 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_238);
    }
    else {
LAB_003d4d06:
      pTVar11 = (TextureFormat *)
                std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_218);
    }
    local_2d8 = (TextureFormat)&local_2c8;
    TVar12 = (TextureFormat)(pTVar11 + 2);
    if (*pTVar11 == TVar12) {
      local_2c8 = *(long *)TVar12;
      TStack_2c0 = pTVar11[3];
    }
    else {
      local_2c8 = *(long *)TVar12;
      local_2d8 = *pTVar11;
    }
    TStack_2d0 = pTVar11[1];
    *pTVar11 = TVar12;
    pTVar11[1].order = R;
    pTVar11[1].type = SNORM_INT8;
    *(undefined1 *)TVar12 = 0;
    pTVar11 = (TextureFormat *)std::__cxx11::string::append((char *)&local_2d8);
    local_288._0_8_ = &local_278;
    TVar12 = (TextureFormat)(pTVar11 + 2);
    if (*pTVar11 == TVar12) {
      local_278._M_allocated_capacity = *(undefined8 *)TVar12;
      local_278._8_8_ = pTVar11[3];
    }
    else {
      local_278._M_allocated_capacity = *(undefined8 *)TVar12;
      local_288._0_8_ = *pTVar11;
    }
    local_288._8_8_ = pTVar11[1];
    *pTVar11 = TVar12;
    pTVar11[1].order = R;
    pTVar11[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar11[2].order = R;
    getPNG((TextureLevel *)local_2b8,archive,(string *)local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._0_8_ != &local_278) {
      operator_delete((void *)local_288._0_8_,local_278._M_allocated_capacity + 1);
    }
    if (local_2d8 != (TextureFormat)&local_2c8) {
      operator_delete((void *)local_2d8,local_2c8 + 1);
    }
    if (local_218 != local_208) {
      operator_delete(local_218,local_208[0] + 1);
    }
    if (local_238 != local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b8,(TextureLevel *)local_2b8);
    this_01 = (ConstPixelBufferAccess *)local_288;
    local_2d8.order = RGBA;
    local_2d8.type = UNORM_INT8;
    data = (void *)local_1d8.m_pixels.m_cap;
    if ((void *)local_1d8.m_pixels.m_cap != (void *)0x0) {
      data = local_1d8.m_pixels.m_ptr;
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (this_01,&local_2d8,local_1d8.m_width,local_1d8.m_height,1,data);
    bVar6 = tcu::fuzzyCompare(local_1e0,"ImageComparison","Image Comparison",
                              (ConstPixelBufferAccess *)local_1b8,this_01,0.002,COMPARE_LOG_RESULT);
    if (bVar6) {
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_2b8);
      tcu::Surface::~Surface(&local_1d8);
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image comparison failed");
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_2b8);
      tcu::Surface::~Surface(&local_1d8);
      if (!bVar6) {
        return STOP;
      }
    }
    local_250 = local_250 + 1;
    paVar17 = paVar17 + 1;
    if (local_250 == 3) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
  } while( true );
}

Assistant:

BasicVariousTessLevelsPosAttrCase::IterateResult BasicVariousTessLevelsPosAttrCase::iterate (void)
{
	static const struct
	{
		float inner[2];
		float outer[4];
	} tessLevelCases[] =
	{
		{ { 9.0f,	9.0f	},	{ 9.0f,		9.0f,	9.0f,	9.0f	} },
		{ { 8.0f,	11.0f	},	{ 13.0f,	15.0f,	18.0f,	21.0f	} },
		{ { 17.0f,	14.0f	},	{ 3.0f,		6.0f,	9.0f,	12.0f	} }
	};

	TestLog&				log					= m_testCtx.getLog();
	const RenderContext&	renderCtx			= m_context.getRenderContext();
	const RandomViewport	viewport			(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32			programGL			= m_program->getProgram();
	const glw::Functions&	gl					= renderCtx.getFunctions();
	const int				patchSize			= m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES	? 3
												: m_primitiveType == TESSPRIMITIVETYPE_QUADS		? 4
												: m_primitiveType == TESSPRIMITIVETYPE_ISOLINES		? 4
												: -1;

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, patchSize);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < DE_LENGTH_OF_ARRAY(tessLevelCases); tessLevelCaseNdx++)
	{
		float innerLevels[2];
		float outerLevels[4];

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(innerLevels); i++)
			innerLevels[i] = (float)getClampedRoundedTessLevel(m_spacing, tessLevelCases[tessLevelCaseNdx].inner[i]);

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(outerLevels); i++)
			outerLevels[i] = (float)getClampedRoundedTessLevel(m_spacing, tessLevelCases[tessLevelCaseNdx].outer[i]);

		log << TestLog::Message << "Tessellation levels: " << tessellationLevelsString(&innerLevels[0], &outerLevels[0], m_primitiveType) << TestLog::EndMessage;

		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelInner0"), innerLevels[0]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelInner1"), innerLevels[1]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter0"), outerLevels[0]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter1"), outerLevels[1]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter2"), outerLevels[2]);
		gl.uniform1f(gl.getUniformLocation(programGL, "u_tessLevelOuter3"), outerLevels[3]);

		gl.clear(GL_COLOR_BUFFER_BIT);

		{
			vector<Vec2> positions;
			positions.reserve(4);

			if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			{
				positions.push_back(Vec2( 0.8f,    0.6f));
				positions.push_back(Vec2( 0.0f, -0.786f));
				positions.push_back(Vec2(-0.8f,    0.6f));
			}
			else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS || m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
			{
				positions.push_back(Vec2(-0.8f, -0.8f));
				positions.push_back(Vec2( 0.8f, -0.8f));
				positions.push_back(Vec2(-0.8f,  0.8f));
				positions.push_back(Vec2( 0.8f,  0.8f));
			}
			else
				DE_ASSERT(false);

			DE_ASSERT((int)positions.size() == patchSize);

			const glu::VertexArrayBinding attrBindings[] =
			{
				glu::va::Float("in_v_position", 2, (int)positions.size(), 0, &positions[0].x())
			};

			glu::draw(m_context.getRenderContext(), programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
				glu::pr::Patches(patchSize));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
		}

		{
			const tcu::Surface			rendered	= getPixels(renderCtx, viewport);
			const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePathPrefix + "_" + de::toString(tessLevelCaseNdx) + ".png");
			const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), rendered.getAccess(), 0.002f, tcu::COMPARE_LOG_RESULT);

			if (!success)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}